

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btype.h
# Opt level: O2

Btype __thiscall verona::operator/(verona *this,Btype *b,Token *f)

{
  element_type *node;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Btype BVar1;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> _Stack_48;
  WFLookup local_38;
  
  node = (b->super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  trieste::operator/(&local_38,&node->node,f);
  ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_48,
             &local_38.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>);
  BtypeDef::make((BtypeDef *)this,&node->node);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_48._M_refcount);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  BVar1.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  BVar1.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Btype)BVar1.super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline Btype operator/(Btype& b, const Token& f)
  {
    return b->make(b->node / f);
  }